

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O0

void __thiscall FirewirePort::PollEvents(FirewirePort *this)

{
  int iVar1;
  int ret;
  fd_set *__arr;
  uint __i;
  int fd;
  timeval timeout;
  fd_set fds;
  FirewirePort *this_local;
  
  memset(&__i,0,0x10);
  iVar1 = raw1394_get_fd(this->handle);
  for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
    fds.fds_bits[(ulong)(uint)__arr - 1] = 0;
  }
  fds.fds_bits[(long)(iVar1 / 0x40) + -1] =
       1L << ((byte)((long)iVar1 % 0x40) & 0x3f) | fds.fds_bits[(long)(iVar1 / 0x40) + -1];
  iVar1 = select(iVar1 + 1,(fd_set *)&timeout.tv_usec,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&__i);
  if (0 < iVar1) {
    raw1394_loop_iterate(this->handle);
  }
  return;
}

Assistant:

void FirewirePort::PollEvents(void)
{
    fd_set fds;
    struct timeval timeout = {0, 0};

    int fd = raw1394_get_fd(handle);
    FD_ZERO(&fds);
    FD_SET(fd, &fds);
    int ret = select(fd+1, &fds, 0, 0, &timeout);
    if (ret > 0)
        raw1394_loop_iterate(handle);
}